

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O0

int evutil_ascii_strcasecmp(char *s1,char *s2)

{
  char cVar1;
  char cVar2;
  char c2;
  char *pcStack_20;
  char c1;
  char *s2_local;
  char *s1_local;
  
  pcStack_20 = s2;
  s2_local = s1;
  while( true ) {
    cVar1 = EVUTIL_TOLOWER_(*s2_local);
    cVar2 = EVUTIL_TOLOWER_(*pcStack_20);
    if (cVar1 < cVar2) {
      return -1;
    }
    if (cVar2 < cVar1) break;
    pcStack_20 = pcStack_20 + 1;
    s2_local = s2_local + 1;
    if (cVar1 == '\0') {
      return 0;
    }
  }
  return 1;
}

Assistant:

int
evutil_ascii_strcasecmp(const char *s1, const char *s2)
{
	char c1, c2;
	while (1) {
		c1 = EVUTIL_TOLOWER_(*s1++);
		c2 = EVUTIL_TOLOWER_(*s2++);
		if (c1 < c2)
			return -1;
		else if (c1 > c2)
			return 1;
		else if (c1 == 0)
			return 0;
	}
}